

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::SetHomeDirectoryViaCommandLine(cmake *this,string *path)

{
  bool bVar1;
  WorkingMode WVar2;
  ulong uVar3;
  string *psVar4;
  cmListFileBacktrace local_d8;
  cmAlphaNum local_c8;
  cmAlphaNum local_98;
  string local_68;
  undefined1 local_38 [8];
  string prev_path;
  string *path_local;
  cmake *this_local;
  
  prev_path.field_2._8_8_ = path;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar4 = GetHomeDirectory_abi_cxx11_(this);
    std::__cxx11::string::string((string *)local_38,(string *)psVar4);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)prev_path.field_2._8_8_);
    if (((bVar1) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) &&
       (WVar2 = GetWorkingMode(this), WVar2 == NORMAL_MODE)) {
      cmAlphaNum::cmAlphaNum(&local_98,"Ignoring extra path from command line:\n \"");
      cmAlphaNum::cmAlphaNum(&local_c8,(string *)local_38);
      cmStrCat<char[2]>(&local_68,&local_98,&local_c8,(char (*) [2])0xd61012);
      local_d8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_d8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_d8);
      IssueMessage(this,WARNING,&local_68,&local_d8);
      cmListFileBacktrace::~cmListFileBacktrace(&local_d8);
      std::__cxx11::string::~string((string *)&local_68);
    }
    SetHomeDirectory(this,(string *)prev_path.field_2._8_8_);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void cmake::SetHomeDirectoryViaCommandLine(std::string const& path)
{
  if (path.empty()) {
    return;
  }

  auto prev_path = this->GetHomeDirectory();
  if (prev_path != path && !prev_path.empty() &&
      this->GetWorkingMode() == NORMAL_MODE) {
    this->IssueMessage(MessageType::WARNING,
                       cmStrCat("Ignoring extra path from command line:\n \"",
                                prev_path, "\""));
  }
  this->SetHomeDirectory(path);
}